

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetCurrentWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  long lVar2;
  ImGuiTable *pIVar3;
  float fVar4;
  
  pIVar1 = GImGui;
  GImGui->CurrentWindow = window;
  if (window != (ImGuiWindow *)0x0) {
    lVar2 = (long)(window->DC).CurrentTableIdx;
    if (lVar2 == -1) {
      pIVar3 = (ImGuiTable *)0x0;
    }
    else {
      pIVar3 = (pIVar1->Tables).Buf.Data + lVar2;
    }
    pIVar1->CurrentTable = pIVar3;
    fVar4 = pIVar1->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar4 = fVar4 * window->ParentWindow->FontWindowScale;
    }
    (pIVar1->DrawListSharedData).FontSize = fVar4;
    pIVar1->FontSize = fVar4;
    return;
  }
  pIVar1->CurrentTable = (ImGuiTable *)0x0;
  return;
}

Assistant:

static void SetCurrentWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow = window;
    g.CurrentTable = window && window->DC.CurrentTableIdx != -1 ? g.Tables.GetByIndex(window->DC.CurrentTableIdx) : NULL;
    if (window)
        g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
}